

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuncTraits.h
# Opt level: O2

int luabridge::detail::
    Invoke<bool,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<char_const*,luabridge::detail::TypeList<int,luabridge::detail::TypeList<int,luabridge::detail::TypeList<int,luabridge::detail::TypeList<bool,void>>>>>>,1>
    ::run<bool(*)(char_const*,char_const*,int,int,int,bool)>
              (lua_State *L,_func_bool_char_ptr_char_ptr_int_int_int_bool **fn)

{
  bool value;
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>,_1>
  args;
  
  ArgList<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>,_1>
  ::ArgList(&args,L);
  value = (**fn)(args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                 .hd,args.
                     super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                     .tl.hd,
                 args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                 .tl.tl.hd,
                 args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                 .tl.tl.tl.hd,
                 args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                 .tl.tl.tl.tl.hd,
                 args.
                 super_TypeListValues<luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<const_char_*,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<int,_luabridge::detail::TypeList<bool,_void>_>_>_>_>_>_>
                 .tl.tl.tl.tl.tl.hd);
  Stack<bool>::push(L,value);
  return 1;
}

Assistant:

static int run(lua_State* L, Fn& fn)
    {
        try
        {
            ArgList<Params, startParam> args(L);
            Stack<ReturnType>::push(L, FuncTraits<Fn>::call(fn, args));
            return 1;
        }
        catch (const std::exception& e)
        {
            return luaL_error(L, e.what());
        }
    }